

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdkanji.c
# Opt level: O0

void do_convert(uchar **to_p,uchar **from_p,char *code)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  int hankaku;
  int jisx0208;
  int j;
  int i;
  int p2;
  int p1;
  uchar *from;
  uchar *to;
  char *code_local;
  uchar **from_p_local;
  uchar **to_p_local;
  
  from = *to_p;
  _p2 = *from_p;
  bVar2 = false;
  bVar4 = false;
  hankaku = 0;
  to = (uchar *)code;
  code_local = (char *)from_p;
  from_p_local = to_p;
  iVar3 = strcmp(code,"JIS7");
  if ((iVar3 == 0) || (iVar3 = strcmp((char *)to,"jis"), iVar3 == 0)) {
    jisx0208 = 0;
    while (_p2[jisx0208] != '\0' && hankaku < 0x2000) {
      if (_p2[jisx0208] == '\x1b') {
        iVar3 = jisx0208 + 1;
        if (_p2[iVar3] == '$') {
          bVar2 = true;
          bVar4 = false;
          iVar3 = jisx0208 + 2;
        }
        else if (_p2[iVar3] == '(') {
          bVar2 = false;
          bVar4 = _p2[jisx0208 + 2] == 'I';
          iVar3 = jisx0208 + 2;
        }
      }
      else {
        iVar3 = jisx0208;
        if (bVar2) {
          from[hankaku] = _p2[jisx0208] + 0x80;
          hankaku = hankaku + 1;
        }
        else if (bVar4) {
          from[hankaku] = 0x8e;
          from[hankaku + 1] = _p2[jisx0208] + 0x80;
          hankaku = hankaku + 2;
        }
        else {
          from[hankaku] = _p2[jisx0208];
          hankaku = hankaku + 1;
        }
      }
      jisx0208 = iVar3;
      jisx0208 = jisx0208 + 1;
    }
  }
  else {
    iVar3 = strcmp((char *)to,"SJIS");
    if (iVar3 != 0) {
      gd_error("invalid code specification: \"%s\"",to);
      return;
    }
    jisx0208 = 0;
    while (_p2[jisx0208] != '\0' && hankaku < 0x2000) {
      bVar1 = _p2[jisx0208];
      i = (int)bVar1;
      if ((uint)i < 0x7f) {
        from[hankaku] = bVar1;
        hankaku = hankaku + 1;
      }
      else {
        if (((uint)i < 0xa1) || (0xdf < (uint)i)) {
          jisx0208 = jisx0208 + 1;
          j = (int)_p2[jisx0208];
          SJIStoJIS(&i,&j);
          from[hankaku] = (char)i + 0x80;
          from[hankaku + 1] = (char)j + 0x80;
        }
        else {
          from[hankaku] = 0x8e;
          from[hankaku + 1] = bVar1;
        }
        hankaku = hankaku + 2;
      }
      jisx0208 = jisx0208 + 1;
    }
  }
  if (hankaku < 0x2000) {
    from[hankaku] = '\0';
  }
  else {
    gd_error("output buffer overflow at do_convert()");
    strcpy((char *)from,(char *)_p2);
  }
  return;
}

Assistant:

static void
do_convert (unsigned char **to_p, unsigned char **from_p, const char *code)
{
	unsigned char *to = *to_p;
	unsigned char *from = *from_p;
#ifdef HAVE_ICONV
	iconv_t cd;
	size_t from_len, to_len;

	if ((cd = iconv_open (EUCSTR, code)) == (iconv_t) - 1) {
		gd_error ("iconv_open() error");
#ifdef HAVE_ERRNO_H
		if (errno == EINVAL)
			gd_error ("invalid code specification: \"%s\" or \"%s\"", EUCSTR, code);
#endif
		ustrcpy (to, from);
		return;
	}

	from_len = strlen ((const char *)from) + 1;
	to_len = BUFSIZ;

	if ((int) (iconv (cd, (char **)from_p, &from_len, (char **)to_p, &to_len))
	        == -1) {
#ifdef HAVE_ERRNO_H
		if (errno == EINVAL)
			gd_error ("invalid end of input string");
		else if (errno == EILSEQ)
			gd_error ("invalid code in input string");
		else if (errno == E2BIG)
			gd_error ("output buffer overflow at do_convert()");
		else
#endif
			gd_error ("something happen");
		ustrcpy (to, from);
		return;
	}

	if (iconv_close (cd) != 0) {
		gd_error ("iconv_close() error");
	}
#else
	int p1, p2, i, j;
	int jisx0208 = FALSE;
	int hankaku = FALSE;

	j = 0;
	if (strcmp (code, NEWJISSTR) == 0 || strcmp (code, OLDJISSTR) == 0) {
		for (i = 0; from[i] != '\0' && j < BUFSIZ; i++) {
			if (from[i] == ESC) {
				i++;
				if (from[i] == '$') {
					jisx0208 = TRUE;
					hankaku = FALSE;
					i++;
				} else if (from[i] == '(') {
					jisx0208 = FALSE;
					i++;
					if (from[i] == 'I')	/* Hankaku Kana */
						hankaku = TRUE;
					else
						hankaku = FALSE;
				}
			} else {
				if (jisx0208)
					to[j++] = from[i] + 128;
				else if (hankaku) {
					to[j++] = SS2;
					to[j++] = from[i] + 128;
				} else
					to[j++] = from[i];
			}
		}
	} else if (strcmp (code, SJISSTR) == 0) {
		for (i = 0; from[i] != '\0' && j < BUFSIZ; i++) {
			p1 = from[i];
			if (p1 < 127)
				to[j++] = p1;
			else if ((p1 >= 161) && (p1 <= 223)) {
				/* Hankaku Kana */
				to[j++] = SS2;
				to[j++] = p1;
			} else {
				p2 = from[++i];
				SJIStoJIS (&p1, &p2);
				to[j++] = p1 + 128;
				to[j++] = p2 + 128;
			}
		}
	} else {
		gd_error ("invalid code specification: \"%s\"", code);
		return;
	}

	if (j >= BUFSIZ) {
		gd_error ("output buffer overflow at do_convert()");
		ustrcpy (to, from);
	} else
		to[j] = '\0';
#endif /* HAVE_ICONV */
}